

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O0

void __thiscall jsonrpcpp::Parameter::Parameter(Parameter *this,Json *json)

{
  bool bVar1;
  Json *json_local;
  Parameter *this_local;
  
  NullableEntity::NullableEntity(&this->super_NullableEntity,id);
  (this->super_NullableEntity).super_Entity._vptr_Entity = (_func_int **)&PTR__Parameter_002070a8;
  (this->super_NullableEntity).super_Entity.field_0xa = 0;
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::vector(&this->param_array);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::map(&this->param_map);
  bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(json,(void *)0x0);
  if (bVar1) {
    parse_json(this,json);
  }
  return;
}

Assistant:

inline Parameter::Parameter(const Json& json) : NullableEntity(entity_t::id), type(value_t::null)
{
    if (json != nullptr)
        Parameter::parse_json(json);
}